

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# liveness.c
# Opt level: O0

Aig_Man_t *
LivenessToSafetyTransformationWithLTL
          (int mode,Abc_Ntk_t *pNtk,Aig_Man_t *p,Vec_Ptr_t *vLive,Vec_Ptr_t *vFair,
          Vec_Ptr_t *vAssertSafety,Vec_Ptr_t *vAssumeSafety,int *numLtlProcessed,
          Vec_Ptr_t *ltlBuffer)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  char *pcVar5;
  Aig_Man_t *p_00;
  size_t sVar6;
  Aig_Obj_t *pAVar7;
  void *pvVar8;
  Abc_Obj_t *pAVar9;
  char *pcVar10;
  Vec_Ptr_t *pVVar11;
  Vec_Ptr_t *p_01;
  ltlNode *plVar12;
  Vec_Ptr_t *vSignal_00;
  Vec_Vec_t *vAigGFMap_00;
  Aig_Obj_t *pAVar13;
  Vec_Ptr_t *pVVar14;
  ltlNode *astNode;
  Aig_Obj_t *pAVar15;
  Vec_Ptr_t *vecInputLtlFormulae;
  Vec_Ptr_t *vPoForLtlProps;
  Vec_Ptr_t *vGFFlopMemory;
  Vec_Ptr_t *vSignalMemory;
  Vec_Vec_t *vAigGFMap;
  ltlNode *tempTopASTNode;
  ltlNode *topNodeOfAST;
  ltlNode *pEnrtyGLOBALLY;
  Vec_Ptr_t *vTopASTNodeArray;
  Vec_Ptr_t *vSignal;
  int liveLatch;
  int loCreated;
  int liCreated;
  int loCopied;
  int liCopied;
  int piCopied;
  char *pFormula;
  char *nodeName;
  Aig_Obj_t *pObjSafetyAndLiveToSafety;
  Aig_Obj_t *pNegatedSafetyConjunction;
  Aig_Obj_t *collectiveAssumeSafety;
  Aig_Obj_t *collectiveAssertSafety;
  Aig_Obj_t *pArgument;
  Aig_Obj_t *pDriverImage;
  Aig_Obj_t *pObjOriginalSafetyPropertyOutput;
  Aig_Obj_t *pObjSafetyPropertyOutput;
  Aig_Obj_t *pObjSafetyGate;
  Aig_Obj_t *pObjLive;
  Aig_Obj_t *pObjAndAcc;
  Aig_Obj_t *pObjXnor;
  Aig_Obj_t *pObjXor;
  Aig_Obj_t *pObjShadowLiDriver;
  Aig_Obj_t *pObjShadowLi;
  Aig_Obj_t *pObjShadowLo;
  Aig_Obj_t *pObjSavedLoAndEquality;
  Aig_Obj_t *pObjSaveAndNotSaved;
  Aig_Obj_t *pObjSaveOrSaved;
  Aig_Obj_t *pMatch;
  Aig_Obj_t *pObj;
  Aig_Obj_t *pObjSavedLi;
  Aig_Obj_t *pObjSavedLo;
  Aig_Obj_t *pObjSavePi;
  int nRegCount;
  int iii;
  int ii;
  int i;
  Aig_Man_t *pNew;
  Vec_Ptr_t *vAssertSafety_local;
  Vec_Ptr_t *vFair_local;
  Vec_Ptr_t *vLive_local;
  Aig_Man_t *p_local;
  Abc_Ntk_t *pNtk_local;
  int mode_local;
  
  pObjSavedLo = (Aig_Obj_t *)0x0;
  pObjSavedLi = (Aig_Obj_t *)0x0;
  pObj = (Aig_Obj_t *)0x0;
  pObjSaveAndNotSaved = (Aig_Obj_t *)0x0;
  pObjSavedLoAndEquality = (Aig_Obj_t *)0x0;
  pObjSafetyAndLiveToSafety = (Aig_Obj_t *)0x0;
  pEnrtyGLOBALLY = (ltlNode *)0x0;
  vecInputLtlFormulae = (Vec_Ptr_t *)0x0;
  iVar1 = Saig_ManPiNum(p);
  vecPis = Vec_PtrAlloc(iVar1 + 1);
  iVar1 = Saig_ManPiNum(p);
  vecPiNames = Vec_PtrAlloc(iVar1 + 1);
  iVar1 = Saig_ManRegNum(p);
  iVar2 = Vec_PtrSize(vLive);
  iVar3 = Vec_PtrSize(vFair);
  vecLos = Vec_PtrAlloc(iVar1 * 2 + 1 + iVar2 + iVar3);
  iVar1 = Saig_ManRegNum(p);
  iVar2 = Vec_PtrSize(vLive);
  iVar3 = Vec_PtrSize(vFair);
  vecLoNames = Vec_PtrAlloc(iVar1 * 2 + 1 + iVar2 + iVar3);
  *numLtlProcessed = 0;
  if ((mode == 0) || (mode == 2)) {
    if (ltlBuffer != (Vec_Ptr_t *)0x0) {
      iVar1 = Vec_PtrSize(ltlBuffer);
      pEnrtyGLOBALLY = (ltlNode *)Vec_PtrAlloc(iVar1);
      printf("\n");
      for (iii = 0; iVar1 = Vec_PtrSize(ltlBuffer), iii < iVar1; iii = iii + 1) {
        pcVar5 = (char *)Vec_PtrEntry(ltlBuffer,iii);
        plVar12 = parseFormulaCreateAST(pcVar5);
        if (plVar12 == (ltlNode *)0x0) {
          printf("\nNo AST has been created for formula %d, no extra logic will be added\n",
                 (ulong)(iii + 1));
        }
        else {
          printf("Formula %d: AST is created, ",(ulong)(iii + 1));
          iVar1 = isWellFormed(plVar12);
          if (iVar1 == 0) {
            printf("Well-formedness check FAILED!!\n");
            printf("AST will be ignored for formula %d, no extra logic will be added for this formula\n"
                   ,(ulong)(iii + 1));
          }
          else {
            printf("Well-formedness check PASSED, ");
            iVar1 = checkSignalNameExistence(pNtk,plVar12);
            if (iVar1 == 0) {
              printf("Signal check FAILED!!");
              printf("AST will be ignored for formula %d, no extra logic will be added for this formula\n"
                     ,(ulong)(iii + 1));
            }
            else {
              printf("Signal check PASSED\n");
              Vec_PtrPush((Vec_Ptr_t *)pEnrtyGLOBALLY,plVar12);
              *numLtlProcessed = *numLtlProcessed + 1;
            }
          }
        }
      }
    }
    printf("\n");
    iVar1 = Vec_PtrSize((Vec_Ptr_t *)pEnrtyGLOBALLY);
    if (iVar1 == 0) {
      printf("\nCurrently aborting, need to take care when Vec_PtrSize( vTopASTNodeArray ) == 0\n");
      exit(0);
    }
  }
  iVar1 = Aig_ManObjNumMax(p);
  p_00 = Aig_ManStart(iVar1 << 1);
  sVar6 = strlen(pNtk->pName);
  pcVar5 = (char *)malloc(sVar6 + 5);
  p_00->pName = pcVar5;
  sprintf(p_00->pName,"%s_%s",pNtk->pName,"l3s");
  p_00->pSpec = (char *)0x0;
  pMatch = Aig_ManConst1(p);
  pAVar7 = Aig_ManConst1(p_00);
  (pMatch->field_5).pData = pAVar7;
  for (iii = 0; iVar1 = Saig_ManPiNum(p), iii < iVar1; iii = iii + 1) {
    pMatch = (Aig_Obj_t *)Vec_PtrEntry(p->vCis,iii);
    pAVar7 = Aig_ObjCreateCi(p_00);
    (pMatch->field_5).pData = pAVar7;
    Vec_PtrPush(vecPis,(pMatch->field_5).pData);
    pAVar9 = Abc_NtkPi(pNtk,iii);
    pcVar5 = Abc_ObjName(pAVar9);
    pcVar5 = Abc_UtilStrsav(pcVar5);
    Vec_PtrPush(vecPiNames,pcVar5);
  }
  if ((mode == 0) || (mode == 2)) {
    pObjSavedLo = Aig_ObjCreateCi(p_00);
    Vec_PtrPush(vecPiNames,"SAVE_BIERE");
  }
  for (iii = 0; iVar1 = Saig_ManRegNum(p), iii < iVar1; iii = iii + 1) {
    pVVar11 = p->vCis;
    iVar1 = Saig_ManPiNum(p);
    pMatch = (Aig_Obj_t *)Vec_PtrEntry(pVVar11,iii + iVar1);
    pAVar7 = Aig_ObjCreateCi(p_00);
    (pMatch->field_5).pData = pAVar7;
    Vec_PtrPush(vecLos,(pMatch->field_5).pData);
    iVar1 = Abc_NtkPiNum(pNtk);
    pAVar9 = Abc_NtkCi(pNtk,iVar1 + iii);
    pcVar5 = Abc_ObjName(pAVar9);
    pcVar5 = Abc_UtilStrsav(pcVar5);
    Vec_PtrPush(vecLoNames,pcVar5);
  }
  if ((mode == 0) || (mode == 2)) {
    pObjSavedLi = Aig_ObjCreateCi(p_00);
    Vec_PtrPush(vecLos,pObjSavedLi);
    Vec_PtrPush(vecLoNames,"SAVED_LO");
  }
  if ((mode == 0) || (mode == 2)) {
    pObjSaveAndNotSaved = Aig_Or(p_00,pObjSavedLo,pObjSavedLi);
    pAVar7 = Aig_Not(pObjSavedLi);
    pObjSavedLoAndEquality = Aig_And(p_00,pObjSavedLo,pAVar7);
  }
  for (iii = 0; iVar1 = Vec_PtrSize(p->vObjs), iii < iVar1; iii = iii + 1) {
    pMatch = (Aig_Obj_t *)Vec_PtrEntry(p->vObjs,iii);
    if ((pMatch != (Aig_Obj_t *)0x0) && (iVar1 = Aig_ObjIsNode(pMatch), iVar1 != 0)) {
      pAVar7 = Aig_ObjChild0Copy(pMatch);
      pAVar13 = Aig_ObjChild1Copy(pMatch);
      pAVar7 = Aig_And(p_00,pAVar7,pAVar13);
      (pMatch->field_5).pData = pAVar7;
    }
  }
  if (((mode == 0) || (mode == 1)) || (mode == 2)) {
    iVar1 = Vec_PtrSize(vAssertSafety);
    if ((iVar1 == 0) || (iVar1 = Vec_PtrSize(vAssumeSafety), iVar1 != 0)) {
      iVar1 = Vec_PtrSize(vAssertSafety);
      if ((iVar1 == 0) || (iVar1 = Vec_PtrSize(vAssumeSafety), iVar1 == 0)) {
        printf(
              "WARNING!! No safety property is found, a new (negated) constant 1 output is created\n"
              );
        pAVar7 = Aig_ManConst1(p_00);
        pObjSafetyAndLiveToSafety = Aig_Not(pAVar7);
        if ((mode == 0) || (mode == 1)) {
          pAVar7 = Aig_ManConst1(p_00);
          pAVar7 = Aig_Not(pAVar7);
          Aig_ObjCreateCo(p_00,pAVar7);
        }
      }
      else {
        pObjLive = Aig_ManConst1(p_00);
        for (iii = 0; pAVar7 = pObjLive, iVar1 = Vec_PtrSize(vAssertSafety), iii < iVar1;
            iii = iii + 1) {
          pMatch = (Aig_Obj_t *)Vec_PtrEntry(vAssertSafety,iii);
          pAVar7 = Aig_ObjFanin0(pMatch);
          pAVar7 = (Aig_Obj_t *)(pAVar7->field_5).pData;
          iVar1 = Aig_ObjFaninC0(pMatch);
          pAVar7 = Aig_NotCond(pAVar7,iVar1);
          pObjLive = Aig_And(p_00,pAVar7,pObjLive);
        }
        pObjLive = Aig_ManConst1(p_00);
        for (iii = 0; iVar1 = Vec_PtrSize(vAssumeSafety), iii < iVar1; iii = iii + 1) {
          pMatch = (Aig_Obj_t *)Vec_PtrEntry(vAssumeSafety,iii);
          pAVar13 = Aig_ObjFanin0(pMatch);
          pAVar13 = (Aig_Obj_t *)(pAVar13->field_5).pData;
          iVar1 = Aig_ObjFaninC0(pMatch);
          pAVar13 = Aig_NotCond(pAVar13,iVar1);
          pObjLive = Aig_And(p_00,pAVar13,pObjLive);
        }
        pAVar13 = Aig_Not(pAVar7);
        pObjSafetyAndLiveToSafety = Aig_And(p_00,pAVar13,pObjLive);
        if ((mode == 0) || (mode == 1)) {
          pAVar7 = Aig_Not(pAVar7);
          pAVar7 = Aig_And(p_00,pAVar7,pObjLive);
          Aig_ObjCreateCo(p_00,pAVar7);
        }
      }
    }
    else {
      pObjLive = Aig_ManConst1(p_00);
      for (iii = 0; iVar1 = Vec_PtrSize(vAssertSafety), iii < iVar1; iii = iii + 1) {
        pMatch = (Aig_Obj_t *)Vec_PtrEntry(vAssertSafety,iii);
        pAVar7 = Aig_ObjFanin0(pMatch);
        pAVar7 = (Aig_Obj_t *)(pAVar7->field_5).pData;
        iVar1 = Aig_ObjFaninC0(pMatch);
        pAVar7 = Aig_NotCond(pAVar7,iVar1);
        pObjLive = Aig_And(p_00,pAVar7,pObjLive);
      }
      pObjSafetyAndLiveToSafety = Aig_Not(pObjLive);
      if ((mode == 0) || (mode == 1)) {
        pAVar7 = Aig_Not(pObjLive);
        Aig_ObjCreateCo(p_00,pAVar7);
      }
    }
  }
  if (pObjSafetyAndLiveToSafety == (Aig_Obj_t *)0x0) {
    __assert_fail("pNegatedSafetyConjunction != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/live/liveness.c"
                  ,0x7ed,
                  "Aig_Man_t *LivenessToSafetyTransformationWithLTL(int, Abc_Ntk_t *, Aig_Man_t *, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Ptr_t *, int *, Vec_Ptr_t *)"
                 );
  }
  if ((mode == 0) || (mode == 2)) {
    iVar1 = Vec_PtrSize((Vec_Ptr_t *)pEnrtyGLOBALLY);
    vecInputLtlFormulae = Vec_PtrAlloc(iVar1);
    Vec_PtrSize((Vec_Ptr_t *)pEnrtyGLOBALLY);
    for (iii = 0; iVar1 = Vec_PtrSize((Vec_Ptr_t *)pEnrtyGLOBALLY), iii < iVar1; iii = iii + 1) {
      pAVar7 = Aig_ObjFanin0(pMatch);
      pAVar7 = Aig_ObjCreateCo(p_00,(Aig_Obj_t *)(pAVar7->field_5).pData);
      Vec_PtrPush(vecInputLtlFormulae,pAVar7);
    }
  }
  pObjSavePi._0_4_ = 0;
  for (iii = 0; iVar1 = Saig_ManRegNum(p), iii < iVar1; iii = iii + 1) {
    pVVar11 = p->vCis;
    iVar1 = Saig_ManPiNum(p);
    pAVar7 = (Aig_Obj_t *)Vec_PtrEntry(pVVar11,iii + iVar1);
    pAVar13 = Saig_ObjLoToLi(p,pAVar7);
    pAVar7 = Aig_ObjFanin0(pAVar13);
    pAVar7 = (Aig_Obj_t *)(pAVar7->field_5).pData;
    iVar1 = Aig_ObjFaninC0(pAVar13);
    pAVar7 = Aig_NotCond(pAVar7,iVar1);
    Aig_ObjCreateCo(p_00,pAVar7);
    pObjSavePi._0_4_ = (int)pObjSavePi + 1;
  }
  if ((mode == 0) || (mode == 2)) {
    pObj = Aig_ObjCreateCo(p_00,pObjSaveAndNotSaved);
    pObjLive = Aig_ManConst1(p_00);
    iii = 0;
    while( true ) {
      pObjSavePi._0_4_ = (int)pObjSavePi + 1;
      iVar1 = Saig_ManRegNum(p);
      if (iVar1 <= iii) break;
      pVVar11 = p->vCis;
      iVar1 = Saig_ManPiNum(p);
      pvVar8 = Vec_PtrEntry(pVVar11,iii + iVar1);
      pAVar7 = Aig_ObjCreateCi(p_00);
      Vec_PtrPush(vecLos,pAVar7);
      iVar1 = Abc_NtkPiNum(pNtk);
      pAVar9 = Abc_NtkCi(pNtk,iVar1 + iii);
      pcVar5 = Abc_ObjName(pAVar9);
      sVar6 = strlen(pcVar5);
      pcVar5 = (char *)malloc(sVar6 + 10);
      iVar1 = Abc_NtkPiNum(pNtk);
      pAVar9 = Abc_NtkCi(pNtk,iVar1 + iii);
      pcVar10 = Abc_ObjName(pAVar9);
      sprintf(pcVar5,"%s__%s",pcVar10,"SHADOW");
      Vec_PtrPush(vecLoNames,pcVar5);
      pAVar13 = Aig_Mux(p_00,pObjSavedLoAndEquality,*(Aig_Obj_t **)((long)pvVar8 + 0x28),pAVar7);
      Aig_ObjCreateCo(p_00,pAVar13);
      pAVar7 = Aig_Exor(p_00,*(Aig_Obj_t **)((long)pvVar8 + 0x28),pAVar7);
      pAVar7 = Aig_Not(pAVar7);
      pObjLive = Aig_And(p_00,pAVar7,pObjLive);
      iii = iii + 1;
    }
    pAVar7 = Aig_And(p_00,pObjSavedLi,pObjLive);
    pVVar11 = Vec_PtrAlloc(10);
    p_01 = Vec_PtrAlloc(10);
    for (pObjSavePi._4_4_ = 0; iVar1 = Vec_PtrSize((Vec_Ptr_t *)pEnrtyGLOBALLY),
        pObjSavePi._4_4_ < iVar1; pObjSavePi._4_4_ = pObjSavePi._4_4_ + 1) {
      plVar12 = (ltlNode *)Vec_PtrEntry((Vec_Ptr_t *)pEnrtyGLOBALLY,pObjSavePi._4_4_);
      vSignal_00 = Vec_PtrAlloc(10);
      vAigGFMap_00 = Vec_VecAlloc(10);
      populateBoolWithAigNodePtr(pNtk,p,p_00,plVar12);
      iVar1 = checkAllBoolHaveAIGPointer(plVar12);
      if (iVar1 == 0) {
        __assert_fail("checkAllBoolHaveAIGPointer( topNodeOfAST )",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/live/liveness.c"
                      ,0x868,
                      "Aig_Man_t *LivenessToSafetyTransformationWithLTL(int, Abc_Ntk_t *, Aig_Man_t *, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Ptr_t *, int *, Vec_Ptr_t *)"
                     );
      }
      populateAigPointerUnitGF(p_00,plVar12,vSignal_00,vAigGFMap_00);
      for (iii = 0; iVar1 = Vec_PtrSize(vSignal_00), iii < iVar1; iii = iii + 1) {
        pAVar13 = (Aig_Obj_t *)Vec_PtrEntry(vSignal_00,iii);
        iVar1 = Vec_PtrFind(pVVar11,pAVar13);
        if (iVar1 == -1) {
          pObjShadowLi = Aig_ObjCreateCi(p_00);
          pAVar15 = Aig_And(p_00,pAVar13,pObjSaveAndNotSaved);
          pAVar15 = Aig_Or(p_00,pObjShadowLi,pAVar15);
          Aig_ObjCreateCo(p_00,pAVar15);
          pObjSavePi._0_4_ = (int)pObjSavePi + 1;
          Vec_PtrPush(pVVar11,pAVar13);
          Vec_PtrPush(p_01,pObjShadowLi);
          Vec_PtrPush(vecLos,pObjShadowLi);
          pcVar5 = (char *)malloc(0x14);
          uVar4 = Aig_ObjId(pObjShadowLi);
          sprintf(pcVar5,"n%d__%s",(ulong)uVar4,"GF_flop");
          Vec_PtrPush(vecLoNames,pcVar5);
        }
        else {
          iVar1 = Vec_PtrFind(pVVar11,pAVar13);
          pObjShadowLi = (Aig_Obj_t *)Vec_PtrEntry(p_01,iVar1);
        }
        nRegCount = 0;
        while( true ) {
          pVVar14 = Vec_VecEntry(vAigGFMap_00,iii);
          iVar1 = Vec_PtrSize(pVVar14);
          if (iVar1 <= nRegCount) break;
          pVVar14 = Vec_VecEntry(vAigGFMap_00,iii);
          astNode = (ltlNode *)Vec_PtrEntry(pVVar14,nRegCount);
          setAIGNodePtrOfGloballyNode(astNode,pObjShadowLi);
          nRegCount = nRegCount + 1;
        }
      }
      buildLogicFromLTLNode(p_00,plVar12);
      pAVar13 = retriveAIGPointerFromLTLNode(plVar12);
      pAVar13 = Aig_Not(pAVar13);
      pAVar13 = Aig_And(p_00,pAVar7,pAVar13);
      printf("liveness output is conjoined with safety assertions\n");
      pAVar13 = Aig_Or(p_00,pAVar13,pObjSafetyAndLiveToSafety);
      pAVar15 = (Aig_Obj_t *)Vec_PtrEntry(vecInputLtlFormulae,pObjSavePi._4_4_);
      Aig_ObjPatchFanin0(p_00,pAVar15,pAVar13);
      Vec_PtrFree(vSignal_00);
      Vec_VecFree(vAigGFMap_00);
    }
  }
  Aig_ManSetRegNum(p_00,(int)pObjSavePi);
  Aig_ManCiCleanupBiere(p_00);
  Aig_ManCoCleanupBiere(p_00);
  Aig_ManCleanup(p_00);
  iVar1 = Aig_ManCheck(p_00);
  if (iVar1 != 0) {
    if ((mode == 0) || (mode == 2)) {
      pVVar11 = p_00->vCos;
      iVar1 = Saig_ManPoNum(p_00);
      iVar2 = Aig_ObjCioId(pObjSavedLi);
      iVar3 = Saig_ManPiNum(p);
      pAVar7 = (Aig_Obj_t *)Vec_PtrEntry(pVVar11,((iVar1 + iVar2) - iVar3) + -1);
      if (pAVar7 != pObj) {
        __assert_fail("(Aig_Obj_t *)Vec_PtrEntry(pNew->vCos, Saig_ManPoNum(pNew)+Aig_ObjCioId(pObjSavedLo)-Saig_ManPiNum(p)-1) == pObjSavedLi"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/live/liveness.c"
                      ,0x8d3,
                      "Aig_Man_t *LivenessToSafetyTransformationWithLTL(int, Abc_Ntk_t *, Aig_Man_t *, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Ptr_t *, int *, Vec_Ptr_t *)"
                     );
      }
      iVar1 = Saig_ManPiNum(p);
      iVar2 = Saig_ManPiNum(p_00);
      if (iVar1 + 1 != iVar2) {
        __assert_fail("Saig_ManPiNum( p ) + 1 == Saig_ManPiNum( pNew )",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/live/liveness.c"
                      ,0x8d4,
                      "Aig_Man_t *LivenessToSafetyTransformationWithLTL(int, Abc_Ntk_t *, Aig_Man_t *, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Ptr_t *, int *, Vec_Ptr_t *)"
                     );
      }
    }
    return p_00;
  }
  __assert_fail("Aig_ManCheck( pNew )",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/live/liveness.c"
                ,0x8cf,
                "Aig_Man_t *LivenessToSafetyTransformationWithLTL(int, Abc_Ntk_t *, Aig_Man_t *, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Ptr_t *, int *, Vec_Ptr_t *)"
               );
}

Assistant:

Aig_Man_t * LivenessToSafetyTransformationWithLTL( int mode, Abc_Ntk_t * pNtk, Aig_Man_t * p, 
                                           Vec_Ptr_t *vLive, Vec_Ptr_t *vFair, Vec_Ptr_t *vAssertSafety, Vec_Ptr_t *vAssumeSafety,
                                           int *numLtlProcessed, Vec_Ptr_t *ltlBuffer )
{
    Aig_Man_t * pNew;
    int i, ii, iii, nRegCount;
    Aig_Obj_t * pObjSavePi = NULL;
    Aig_Obj_t *pObjSavedLo = NULL, *pObjSavedLi = NULL;
    Aig_Obj_t *pObj, *pMatch;
    Aig_Obj_t *pObjSaveOrSaved = NULL, *pObjSaveAndNotSaved = NULL, *pObjSavedLoAndEquality;
    Aig_Obj_t *pObjShadowLo, *pObjShadowLi, *pObjShadowLiDriver;
    Aig_Obj_t *pObjXor, *pObjXnor, *pObjAndAcc;
    Aig_Obj_t *pObjLive, *pObjSafetyGate;
    Aig_Obj_t *pObjSafetyPropertyOutput;
    Aig_Obj_t *pObjOriginalSafetyPropertyOutput;
    Aig_Obj_t *pDriverImage, *pArgument, *collectiveAssertSafety, *collectiveAssumeSafety;
    Aig_Obj_t *pNegatedSafetyConjunction = NULL;
    Aig_Obj_t *pObjSafetyAndLiveToSafety;
    char *nodeName, *pFormula;
    int piCopied = 0, liCopied = 0, loCopied = 0, liCreated = 0, loCreated = 0, liveLatch = 0;//, piVecIndex = 0, fairLatch = 0;
    Vec_Ptr_t *vSignal, *vTopASTNodeArray = NULL;
    ltlNode *pEnrtyGLOBALLY;
    ltlNode *topNodeOfAST, *tempTopASTNode;
    Vec_Vec_t *vAigGFMap;
    Vec_Ptr_t *vSignalMemory, *vGFFlopMemory, *vPoForLtlProps = NULL;
    Vec_Ptr_t *vecInputLtlFormulae;
    
    vecPis = Vec_PtrAlloc( Saig_ManPiNum( p ) + 1);
    vecPiNames = Vec_PtrAlloc( Saig_ManPiNum( p ) + 1);

    vecLos = Vec_PtrAlloc( Saig_ManRegNum( p )*2 + 1 + Vec_PtrSize( vLive ) + Vec_PtrSize( vFair ) );
    vecLoNames = Vec_PtrAlloc( Saig_ManRegNum( p )*2 + 1 + Vec_PtrSize( vLive ) + Vec_PtrSize( vFair ) );

    //****************************************************************
    //step0: Parsing the LTL formula
    //****************************************************************
    //Vec_PtrForEachEntry( char *, pNtk->vLtlProperties, pFormula, i )
    //    printf("\ninput LTL formula [%d] = %s\n", i, pFormula );


#ifdef MULTIPLE_LTL_FORMULA


    //***************************************************************************
    //Reading input LTL formulae from Ntk data-structure and creating 
    //AST for them, Steps involved: 
    //        parsing -> AST creation -> well-formedness check -> signal name check
    //***************************************************************************

    //resetting numLtlProcessed
    *numLtlProcessed = 0;
    
    if( mode == FULL_BIERE_MODE || mode == IGNORE_SAFETY_KEEP_LIVENESS_MODE )
    {
        //if( ltlBuffer )
        vecInputLtlFormulae = ltlBuffer;
        //vecInputLtlFormulae = pNtk->vLtlProperties;
        if( vecInputLtlFormulae )
        {
            vTopASTNodeArray = Vec_PtrAlloc( Vec_PtrSize( vecInputLtlFormulae ) );
            printf("\n");
            Vec_PtrForEachEntry( char *, vecInputLtlFormulae, pFormula, i )
            {
                tempTopASTNode = parseFormulaCreateAST( pFormula );
                //traverseAbstractSyntaxTree_postFix( tempTopASTNode );
                if( tempTopASTNode )
                {
                    printf("Formula %d: AST is created, ", i+1);
                    if( isWellFormed( tempTopASTNode ) )
                        printf("Well-formedness check PASSED, ");
                    else
                    {
                        printf("Well-formedness check FAILED!!\n");
                        printf("AST will be ignored for formula %d, no extra logic will be added for this formula\n", i+1 );
                        //do memory management to free the created AST
                        continue;
                    }
                    if( checkSignalNameExistence( pNtk, tempTopASTNode ) )
                        printf("Signal check PASSED\n");
                    else
                    {
                        printf("Signal check FAILED!!");
                        printf("AST will be ignored for formula %d, no extra logic will be added for this formula\n", i+1 );
                        //do memory management to free the created AST
                        continue;
                    }
                    Vec_PtrPush( vTopASTNodeArray, tempTopASTNode );
                    (*numLtlProcessed)++;
                }
                else
                    printf("\nNo AST has been created for formula %d, no extra logic will be added\n", i+1 );
            }
        }
        printf("\n");
        if( Vec_PtrSize( vTopASTNodeArray ) == 0 )
        {
            //printf("\nNo AST has been created for any formula; hence the circuit is left untouched\n");
            printf("\nCurrently aborting, need to take care when Vec_PtrSize( vTopASTNodeArray ) == 0\n");
            exit(0);
        }
    }

        //****************************************************************
        // Step1: create the new manager
        // Note: The new manager is created with "2 * Aig_ManObjNumMax(p)"
        // nodes, but this selection is arbitrary - need to be justified
        //****************************************************************
        pNew = Aig_ManStart( 2 * Aig_ManObjNumMax(p) );
        pNew->pName = (char *)malloc( strlen( pNtk->pName ) + strlen("_l3s") + 1 );
        sprintf(pNew->pName, "%s_%s", pNtk->pName, "l3s");
        pNew->pSpec = NULL;
    
        //****************************************************************
        // Step 2: map constant nodes
        //****************************************************************
        pObj = Aig_ManConst1( p );
        pObj->pData = Aig_ManConst1( pNew );

        //****************************************************************
        // Step 3: create true PIs
        //****************************************************************
        Saig_ManForEachPi( p, pObj, i )
        {
            piCopied++;
            pObj->pData = Aig_ObjCreateCi(pNew);
            Vec_PtrPush( vecPis, pObj->pData );
            nodeName = Abc_UtilStrsav(Abc_ObjName( Abc_NtkPi( pNtk, i ) ));
            Vec_PtrPush( vecPiNames, nodeName );
        }

        //****************************************************************
        // Step 4: create the special Pi corresponding to SAVE
        //****************************************************************
        if( mode == FULL_BIERE_MODE || mode == IGNORE_SAFETY_KEEP_LIVENESS_MODE )
        {
            pObjSavePi = Aig_ObjCreateCi( pNew );
            nodeName = "SAVE_BIERE",
            Vec_PtrPush( vecPiNames, nodeName );
        }
        
        //****************************************************************
        // Step 5: create register outputs
        //****************************************************************
        Saig_ManForEachLo( p, pObj, i )
        {
            loCopied++;
            pObj->pData = Aig_ObjCreateCi(pNew);
            Vec_PtrPush( vecLos, pObj->pData );
            nodeName = Abc_UtilStrsav(Abc_ObjName( Abc_NtkCi( pNtk, Abc_NtkPiNum(pNtk) + i ) ));
            Vec_PtrPush( vecLoNames, nodeName );
        }

        //****************************************************************
        // Step 6: create "saved" register output
        //****************************************************************
        if( mode == FULL_BIERE_MODE || mode == IGNORE_SAFETY_KEEP_LIVENESS_MODE )
        {
            loCreated++;
            pObjSavedLo = Aig_ObjCreateCi( pNew );
            Vec_PtrPush( vecLos, pObjSavedLo );
            nodeName = "SAVED_LO";
            Vec_PtrPush( vecLoNames, nodeName );
        }

        //****************************************************************
        // Step 7: create the OR gate and the AND gate directly fed by "SAVE" Pi
        //****************************************************************
        if( mode == FULL_BIERE_MODE || mode == IGNORE_SAFETY_KEEP_LIVENESS_MODE )
        {
            pObjSaveOrSaved = Aig_Or( pNew, pObjSavePi, pObjSavedLo );
            pObjSaveAndNotSaved = Aig_And( pNew, pObjSavePi, Aig_Not(pObjSavedLo) );
        }

        //********************************************************************
        // Step 8: create internal nodes
        //********************************************************************
        Aig_ManForEachNode( p, pObj, i )
        {
            pObj->pData = Aig_And( pNew, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj) );
        }

        
        //********************************************************************
        // Step 8.x : create PO for each safety assertions
        // NOTE : Here the output is purposely inverted as it will be thrown to 
        // dprove
        //********************************************************************
        assert( pNegatedSafetyConjunction == NULL );
        if( mode == FULL_BIERE_MODE || mode == IGNORE_LIVENESS_KEEP_SAFETY_MODE || mode == IGNORE_SAFETY_KEEP_LIVENESS_MODE)
        {
            if( Vec_PtrSize( vAssertSafety ) != 0 && Vec_PtrSize( vAssumeSafety ) == 0 )
            {
                pObjAndAcc = Aig_ManConst1( pNew );
                Vec_PtrForEachEntry( Aig_Obj_t *, vAssertSafety, pObj, i )
                {
                    pArgument = Aig_NotCond( (Aig_Obj_t *)Aig_ObjFanin0(pObj)->pData, Aig_ObjFaninC0( pObj ) );
                    pObjAndAcc = Aig_And( pNew, pArgument, pObjAndAcc );
                }
                pNegatedSafetyConjunction = Aig_Not(pObjAndAcc);
                if( mode == FULL_BIERE_MODE || mode == IGNORE_LIVENESS_KEEP_SAFETY_MODE )
                    pObjOriginalSafetyPropertyOutput = Aig_ObjCreateCo( pNew, Aig_Not(pObjAndAcc) );
            }
            else if( Vec_PtrSize( vAssertSafety ) != 0 && Vec_PtrSize( vAssumeSafety ) != 0 )
            {
                pObjAndAcc = Aig_ManConst1( pNew );
                Vec_PtrForEachEntry( Aig_Obj_t *, vAssertSafety, pObj, i )
                {
                    pArgument = Aig_NotCond( (Aig_Obj_t *)Aig_ObjFanin0(pObj)->pData, Aig_ObjFaninC0( pObj ) );
                    pObjAndAcc = Aig_And( pNew, pArgument, pObjAndAcc );
                }
                collectiveAssertSafety = pObjAndAcc;

                pObjAndAcc = Aig_ManConst1( pNew );
                Vec_PtrForEachEntry( Aig_Obj_t *, vAssumeSafety, pObj, i )
                {
                    pArgument = Aig_NotCond( (Aig_Obj_t *)Aig_ObjFanin0(pObj)->pData, Aig_ObjFaninC0( pObj ) );
                    pObjAndAcc = Aig_And( pNew, pArgument, pObjAndAcc );
                }
                collectiveAssumeSafety = pObjAndAcc;
                pNegatedSafetyConjunction =  Aig_And( pNew, Aig_Not(collectiveAssertSafety), collectiveAssumeSafety );
                if( mode == FULL_BIERE_MODE || mode == IGNORE_LIVENESS_KEEP_SAFETY_MODE )
                    pObjOriginalSafetyPropertyOutput = Aig_ObjCreateCo( pNew, Aig_And( pNew, Aig_Not(collectiveAssertSafety), collectiveAssumeSafety ) );
            }
            else
            {
                printf("WARNING!! No safety property is found, a new (negated) constant 1 output is created\n");
                pNegatedSafetyConjunction = Aig_Not( Aig_ManConst1(pNew) );
                if( mode == FULL_BIERE_MODE || mode == IGNORE_LIVENESS_KEEP_SAFETY_MODE )
                    pObjOriginalSafetyPropertyOutput = Aig_ObjCreateCo( pNew, Aig_Not( Aig_ManConst1(pNew) ) );
            }
        }
        assert( pNegatedSafetyConjunction != NULL );

        //********************************************************************
        // Step 9: create the safety property output gate for the liveness properties
        // discuss with Sat/Alan for an alternative implementation
        //********************************************************************
        if( mode == FULL_BIERE_MODE || mode == IGNORE_SAFETY_KEEP_LIVENESS_MODE )
        {
            vPoForLtlProps = Vec_PtrAlloc( Vec_PtrSize( vTopASTNodeArray ) );
            if( Vec_PtrSize( vTopASTNodeArray ) )
            {
                //no effective AST for any input LTL property
                //must do something graceful
            }
            for( i=0; i<Vec_PtrSize( vTopASTNodeArray ); i++ )
            {
                pObjSafetyPropertyOutput = Aig_ObjCreateCo( pNew, (Aig_Obj_t *)Aig_ObjFanin0(pObj)->pData );
                Vec_PtrPush( vPoForLtlProps, pObjSafetyPropertyOutput );
            }
        }

        //*************************************************************************************
        // Step 10: Placeholder PO's were created for Liveness property outputs in the
        // last step. FYI, # of new liveness property outputs = # of LTL properties in the circuit
        // It is time for creation of loop LI's and other stuff
        // Now creating register inputs for the original flops
        //*************************************************************************************
        nRegCount = 0;
        
        Saig_ManForEachLo( p, pObj, i )
        {
            pMatch = Saig_ObjLoToLi( p, pObj );
            Aig_ObjCreateCo( pNew, Aig_NotCond((Aig_Obj_t *)Aig_ObjFanin0(pMatch)->pData, Aig_ObjFaninC0( pMatch ) ) );
            nRegCount++;
            liCopied++;
        }

        //*************************************************************************************
        // Step 11: create register input corresponding to the register "saved"
        //*************************************************************************************
        if( mode == FULL_BIERE_MODE || mode == IGNORE_SAFETY_KEEP_LIVENESS_MODE )
        {
            #ifndef DUPLICATE_CKT_DEBUG
                pObjSavedLi = Aig_ObjCreateCo( pNew, pObjSaveOrSaved );
                nRegCount++;
                liCreated++;

                pObjAndAcc = Aig_ManConst1( pNew );

                //*************************************************************************************
                // Step 11: create the family of shadow registers, then create the cascade of Xnor 
                // and And gates for the comparator 
                //*************************************************************************************
                Saig_ManForEachLo( p, pObj, i )
                {
                //printf("\nKEMON RENDY = %s", Abc_ObjName( Abc_NtkCi( pNtk, Abc_NtkPiNum(pNtk) + i )) );
                //top|route0_target0_queue_with_credit0_queue0
                //top|route0_master0_queue2
                //    if( strcmp(  Abc_ObjName( Abc_NtkCi( pNtk, Abc_NtkPiNum(pNtk) + i ) ), "top|route0_queue1_num[0]" ) == 0 
                //            || strcmp(  Abc_ObjName( Abc_NtkCi( pNtk, Abc_NtkPiNum(pNtk) + i ) ), "top|route0_queue1_num[1]" ) == 0 || strcmp(  Abc_ObjName( Abc_NtkCi( pNtk, Abc_NtkPiNum(pNtk) + i ) ), "top|route0_queue1_num[2]" ) == 0 )
                    {        
                        pObjShadowLo = Aig_ObjCreateCi( pNew );

                    #ifdef PROPAGATE_NAMES
                        Vec_PtrPush( vecLos, pObjShadowLo );
                        nodeName = (char *)malloc( strlen( Abc_ObjName( Abc_NtkCi( pNtk, Abc_NtkPiNum(pNtk) + i ) ) ) + 10 );
                        sprintf( nodeName, "%s__%s", Abc_ObjName( Abc_NtkCi( pNtk, Abc_NtkPiNum(pNtk) + i ) ), "SHADOW" );
                        
                        Vec_PtrPush( vecLoNames, nodeName );
                    #endif

                        pObjShadowLiDriver = Aig_Mux( pNew, pObjSaveAndNotSaved, (Aig_Obj_t *)pObj->pData, pObjShadowLo );
                        pObjShadowLi = Aig_ObjCreateCo( pNew, pObjShadowLiDriver );
                        nRegCount++;
                        loCreated++; liCreated++;
            
                        pObjXor = Aig_Exor( pNew, (Aig_Obj_t *)pObj->pData, pObjShadowLo );
                        pObjXnor = Aig_Not( pObjXor );
                    
                        pObjAndAcc = Aig_And( pNew, pObjXnor, pObjAndAcc );
                    }
                }

                // create the AND gate whose output will be the signal "looped"
                pObjSavedLoAndEquality = Aig_And( pNew, pObjSavedLo, pObjAndAcc );

                // create the master AND gate and corresponding AND and OR logic for the liveness properties
                
                //*************************************************************************************
                // Step 11: logic for LTL properties:- (looped & ~theta) where theta is the input ltl 
                // property
                // Description of some data-structure:
                //-------------------------------------------------------------------------------------
                // Name          | Type            | Purpose
                //-------------------------------------------------------------------------------------
                // vSignalMemory | Vec_Ptr_t *     | A vector across all ASTs of the LTL properties
                //                 |                   | It remembers if OR+Latch for GF node has already been
                //                 |                   | created for a particular signal.
                //               |                 |
                // vGFFlopMemory | Vec_Ptr_t *     | A vector across all ASTs of the LTL properties
                //                 |                 | remembers if OR+Latch of a GF node has already been created
                //                 |                 |
                // vSignal         | Vec_Ptr_t *     | vector for each AST; contains pointers from GF nodes
                //               |                 | to AIG signals
                //                 |                   |
                // vAigGFMap     | Vec_Vec_t *     | vAigGFMap[ index ] = vector of GF nodes pointing to
                //               |                 | the same AIG node; "index" is the index of that
                //               |                 | AIG node in the vector vSignal
                //*************************************************************************************
                
                vSignalMemory = Vec_PtrAlloc(10);
                vGFFlopMemory = Vec_PtrAlloc(10);

                Vec_PtrForEachEntry( ltlNode *, vTopASTNodeArray, topNodeOfAST, iii )
                {
                                    vSignal = Vec_PtrAlloc( 10 );
                                    vAigGFMap = Vec_VecAlloc( 10 );
                                    
                                    //*************************************************************************************
                                    //Step 11a: for the current AST, find out the leaf level Boolean signal pointers from 
                                    // the NEW aig.
                                    //*************************************************************************************
                                    populateBoolWithAigNodePtr( pNtk, p, pNew, topNodeOfAST );
                                    assert( checkAllBoolHaveAIGPointer( topNodeOfAST ) );

                                    //*************************************************************************************
                                    //Step 11b: for each GF node, compute the pointer in AIG that it should point to
                                    // In particular, if the subtree below GF is some Boolean crown (including the case
                                    // of simple negation, create new logic and populate the AIG pointer in GF node
                                    // accordingly
                                    //*************************************************************************************
                                    populateAigPointerUnitGF( pNew, topNodeOfAST, vSignal, vAigGFMap );
                                    
                                    //*************************************************************************************
                                    //Step 11c: everything below GF are computed. Now, it is time to create logic for individual 
                                    // GF nodes (i.e. the OR gate and the latch and the Boolean crown of the AST
                                    //*************************************************************************************
                                    Vec_PtrForEachEntry( Aig_Obj_t *, vSignal, pObj, i )
                                    {
                                        //*********************************************************
                                        // Step 11c.1: if the OR+Latch of the particular signal is
                                        // not already created, create it. It may have already been 
                                        // created from another property, so check it before creation
                                        //*********************************************************
                                        if( Vec_PtrFind( vSignalMemory, pObj ) == -1 )
                                        {
                                            liveLatch++;

                                            pDriverImage = pObj;
                                            pObjShadowLo = Aig_ObjCreateCi( pNew );
                                            pObjShadowLiDriver = Aig_Or( pNew, pObjShadowLo, Aig_And( pNew, pDriverImage, pObjSaveOrSaved ) );
                                            pObjShadowLi = Aig_ObjCreateCo( pNew, pObjShadowLiDriver );

                                            nRegCount++;
                                            loCreated++; liCreated++;

                                            Vec_PtrPush( vSignalMemory, pObj );
                                            Vec_PtrPush( vGFFlopMemory, pObjShadowLo );

                                            #if 1
                                            #ifdef PROPAGATE_NAMES
                                                Vec_PtrPush( vecLos, pObjShadowLo );
                                                //nodeName = (char *)malloc( strlen( Abc_ObjName( Abc_NtkPo( pNtk, getPoIndex( p, pObj ) ) ) ) + 12 );
                                                //sprintf( nodeName, "%s__%s", Abc_ObjName( Abc_NtkPo( pNtk, getPoIndex( p, pObj ) ) ), "LIVENESS" );
                                                nodeName = (char *)malloc( 20 );
                                                sprintf( nodeName, "n%d__%s", Aig_ObjId(pObjShadowLo), "GF_flop" );
                                                Vec_PtrPush( vecLoNames, nodeName );
                                            #endif
                                            #endif
                                        }
                                        else
                                            pObjShadowLo = (Aig_Obj_t *)Vec_PtrEntry( vGFFlopMemory, Vec_PtrFind( vSignalMemory, pObj ) );
                                                                                
                                        Vec_VecForEachEntryLevel( ltlNode *, vAigGFMap, pEnrtyGLOBALLY, ii, i )
                                            setAIGNodePtrOfGloballyNode( pEnrtyGLOBALLY, pObjShadowLo);
                                            

                                        //#ifdef PROPAGATE_NAMES
                                        //    Vec_PtrPush( vecLos, pObjShadowLo );
                                        //    nodeName = (char *)malloc( strlen( Abc_ObjName( Abc_NtkPo( pNtk, getPoIndex( p, pObj ) ) ) ) + 12 );
                                        //    sprintf( nodeName, "%s__%s", Abc_ObjName( Abc_NtkPo( pNtk, getPoIndex( p, pObj ) ) ), "LIVENESS" );
                                        //    Vec_PtrPush( vecLoNames, nodeName );
                                        //#endif
                                        
                                    }
                                    
                                    //*********************************************************
                                    //Step 11c.2: creating the Boolean crown
                                    //*********************************************************
                                    buildLogicFromLTLNode( pNew, topNodeOfAST );

                                    //*********************************************************
                                    //Step 11c.3: creating logic for (looped & ~theta) and patching
                                    // it with the proper PO
                                    //Note: if ALLOW_SAFETY_PROPERTIES is defined then the final AND
                                    //gate is a conjunction of safety & liveness, i.e. SAFETY & (looped => theta)
                                    //since ABC convention demands a NOT gate at the end, the property logic 
                                    //becomes !( SAFETY & (looped => theta) ) = !SAFETY + (looped & !theta)
                                    //*********************************************************
                                    pObjLive = retriveAIGPointerFromLTLNode( topNodeOfAST );
                                    pObjSafetyGate = Aig_And( pNew, pObjSavedLoAndEquality, Aig_Not(pObjLive) );
                                    #ifdef ALLOW_SAFETY_PROPERTIES
                                        printf("liveness output is conjoined with safety assertions\n");
                                        pObjSafetyAndLiveToSafety = Aig_Or( pNew, pObjSafetyGate, pNegatedSafetyConjunction );
                                        pObjSafetyPropertyOutput = (Aig_Obj_t *)Vec_PtrEntry( vPoForLtlProps, iii );
                                        Aig_ObjPatchFanin0( pNew, pObjSafetyPropertyOutput, pObjSafetyAndLiveToSafety );
                                    #else
                                        pObjSafetyPropertyOutput = Vec_PtrEntry( vPoForLtlProps, iii );
                                        Aig_ObjPatchFanin0( pNew, pObjSafetyPropertyOutput, pObjSafetyGate );
                                    #endif
                                    //refreshing vSignal and vAigGFMap arrays
                                    Vec_PtrFree( vSignal );
                                    Vec_VecFree( vAigGFMap );
                }
                                
            #endif
        }
#endif

    Aig_ManSetRegNum( pNew, nRegCount );

    Aig_ManCiCleanupBiere( pNew );
    Aig_ManCoCleanupBiere( pNew );
    
    Aig_ManCleanup( pNew );
    
    assert( Aig_ManCheck( pNew ) );
    
    if( mode == FULL_BIERE_MODE || mode == IGNORE_SAFETY_KEEP_LIVENESS_MODE )
    {
            assert((Aig_Obj_t *)Vec_PtrEntry(pNew->vCos, Saig_ManPoNum(pNew)+Aig_ObjCioId(pObjSavedLo)-Saig_ManPiNum(p)-1) == pObjSavedLi);
            assert( Saig_ManPiNum( p ) + 1 == Saig_ManPiNum( pNew ) );
            //assert( Saig_ManRegNum( pNew ) == Saig_ManRegNum( p ) * 2 + 1 + liveLatch + fairLatch );
    }


    return pNew;
}